

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O3

void __thiscall AActor::VelFromAngle(AActor *this,DAngle *angle,double speed)

{
  double dVar1;
  
  dVar1 = FFastTrig::cos(&fasttrig,angle->Degrees * 11930464.711111112 + 6755399441055744.0);
  (this->Vel).X = dVar1 * speed;
  dVar1 = FFastTrig::sin(&fasttrig,angle->Degrees * 11930464.711111112 + 6755399441055744.0);
  (this->Vel).Y = dVar1 * speed;
  return;
}

Assistant:

void VelFromAngle(DAngle angle, double speed)
	{
		Vel.X = speed * angle.Cos();
		Vel.Y = speed * angle.Sin();
	}